

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Optimisations.h
# Opt level: O3

void soul::Optimisations::makeFunctionCallInline
               (Program *program,Function *parentFunction,size_t blockIndex,FunctionCall *call)

{
  Function *pFVar1;
  bool bVar2;
  FunctionCall *pFVar3;
  Module *m;
  Inliner local_100;
  
  bVar2 = heart::Utilities::canFunctionBeInlined(program,parentFunction,call);
  if (!bVar2) {
    throwInternalCompilerError
              ("heart::Utilities::canFunctionBeInlined (program, parentFunction, call)",
               "makeFunctionCallInline",0xdf);
  }
  pFVar3 = (FunctionCall *)
           (((parentFunction->blocks).
             super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
             ._M_impl.super__Vector_impl_data._M_start[blockIndex].object)->statements).firstObject;
  while( true ) {
    if (pFVar3 == (FunctionCall *)0x0) {
      throwInternalCompilerError
                ("contains (parentFunction.blocks[blockIndex]->statements, std::addressof (call))",
                 "makeFunctionCallInline",0xe0);
    }
    if (pFVar3 == call) break;
    pFVar3 = (FunctionCall *)(pFVar3->super_Assignment).super_Statement.nextObject;
  }
  pFVar1 = (call->function).object;
  if (pFVar1 != (Function *)0x0) {
    m = Program::getModuleContainingFunction(program,pFVar1);
    pFVar1 = (call->function).object;
    if (pFVar1 != (Function *)0x0) {
      Inliner::Inliner(&local_100,m,parentFunction,blockIndex,call,pFVar1);
      Inliner::perform(&local_100);
      std::
      _Hashtable<soul::pool_ref<soul::heart::Variable>,_std::pair<const_soul::pool_ref<soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<soul::heart::Variable>_>,_std::hash<soul::pool_ref<soul::heart::Variable>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_100.remappedVariables._M_h);
      std::
      _Hashtable<soul::pool_ref<soul::heart::Block>,_std::pair<const_soul::pool_ref<soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<soul::heart::Block>_>,_std::hash<soul::pool_ref<soul::heart::Block>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_100.remappedBlocks._M_h);
      if (local_100.newBlocks.
          super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_100.newBlocks.
                        super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_100.newBlocks.
                              super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_100.newBlocks.
                              super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100.inlinedFnName._M_dataplus._M_p != &local_100.inlinedFnName.field_2) {
        operator_delete(local_100.inlinedFnName._M_dataplus._M_p,
                        local_100.inlinedFnName.field_2._M_allocated_capacity + 1);
      }
      return;
    }
  }
  throwInternalCompilerError("object != nullptr","operator*",0x3b);
}

Assistant:

static void makeFunctionCallInline (Program& program, heart::Function& parentFunction,
                                        size_t blockIndex, heart::FunctionCall& call)
    {
        SOUL_ASSERT (heart::Utilities::canFunctionBeInlined (program, parentFunction, call));
        SOUL_ASSERT (contains (parentFunction.blocks[blockIndex]->statements, std::addressof (call)));

        Inliner (program.getModuleContainingFunction (call.getFunction()),
                 parentFunction, blockIndex, call, call.getFunction()).perform();
    }